

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O1

void Res_SimDeriveInfoReplicate(Res_Sim_t *p)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  Vec_Ptr_t *pVVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  void *pvVar7;
  int iVar8;
  long lVar9;
  
  pVVar1 = p->pAig->vPos;
  if (0 < pVVar1->nSize) {
    ppvVar2 = pVVar1->pArray;
    pVVar3 = p->vPats;
    lVar6 = 0;
    do {
      iVar8 = *(int *)((long)ppvVar2[lVar6] + 0x10);
      if ((((long)iVar8 < 0) || (pVVar3->nSize <= iVar8)) || (p->vOuts->nSize <= lVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (0 < p->nPats) {
        pvVar4 = pVVar3->pArray[iVar8];
        pvVar7 = p->vOuts->pArray[lVar6];
        iVar8 = 0;
        do {
          if (0 < p->nWords) {
            lVar9 = 0;
            lVar5 = 0;
            do {
              *(undefined4 *)((long)pvVar7 + lVar5 * 4) = *(undefined4 *)((long)pvVar4 + lVar5 * 4);
              lVar5 = lVar5 + 1;
              lVar9 = lVar9 + 4;
            } while (lVar5 < p->nWords);
            pvVar7 = (void *)((long)pvVar7 + lVar9);
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 < p->nPats);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar1->nSize);
  }
  return;
}

Assistant:

void Res_SimDeriveInfoReplicate( Res_Sim_t * p )
{
    unsigned * pInfo, * pInfo2;
    Abc_Obj_t * pObj;
    int i, j, w;
    Abc_NtkForEachPo( p->pAig, pObj, i )
    {
        pInfo = (unsigned *)Vec_PtrEntry( p->vPats, pObj->Id );
        pInfo2 = (unsigned *)Vec_PtrEntry( p->vOuts, i );
        for ( j = 0; j < p->nPats; j++ )
            for ( w = 0; w < p->nWords; w++ )
                *pInfo2++ = pInfo[w];
    }
}